

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spvIR.h
# Opt level: O0

void __thiscall
spv::Block::addInstruction
          (Block *this,unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *inst)

{
  Id IVar1;
  pointer this_00;
  Module *this_01;
  Instruction *raw_instruction;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *inst_local;
  Block *this_local;
  
  this_00 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::get(inst);
  std::
  vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ::push_back(&this->instructions,inst);
  spv::Instruction::setBlock(this_00,this);
  IVar1 = spv::Instruction::getResultId(this_00);
  if (IVar1 != 0) {
    this_01 = spv::Function::getParent(this->parent);
    Module::mapInstruction(this_01,this_00);
  }
  return;
}

Assistant:

__inline void Block::addInstruction(std::unique_ptr<Instruction> inst)
{
    Instruction* raw_instruction = inst.get();
    instructions.push_back(std::move(inst));
    raw_instruction->setBlock(this);
    if (raw_instruction->getResultId())
        parent.getParent().mapInstruction(raw_instruction);
}